

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void str_sanitize_strong(char *str_in)

{
  byte bVar1;
  byte *pbVar2;
  
  bVar1 = *str_in;
  if (bVar1 != 0) {
    pbVar2 = (byte *)(str_in + 1);
    do {
      bVar1 = bVar1 & 0x7f;
      if (bVar1 < 0x21) {
        bVar1 = 0x20;
      }
      pbVar2[-1] = bVar1;
      bVar1 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (bVar1 != 0);
  }
  return;
}

Assistant:

void str_sanitize_strong(char *str_in)
{
	unsigned char *str = (unsigned char *)str_in;
	while(*str)
	{
		*str &= 0x7f;
		if(*str < 32)
			*str = 32;
		str++;
	}
}